

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

void __thiscall Bstrlib::CBString::CBString(CBString *this,char *s)

{
  size_t sVar1;
  uchar *__dest;
  CBStringException *pCVar2;
  uint uVar3;
  allocator local_81;
  CBStringException bstr__cppwrapper_exception;
  string local_58;
  string local_38;
  
  this->_vptr_CBString = (_func_int **)&PTR__CBString_001a1870;
  if (s != (char *)0x0) {
    sVar1 = strlen(s);
    if (0x7ffffffe < sVar1) {
      std::__cxx11::string::string
                ((string *)&local_38,"CBString::Failure in (char *) constructor, string too large",
                 &local_81);
      CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
      CBStringException::CBStringException(pCVar2,&bstr__cppwrapper_exception);
      __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
    }
    (this->super_tagbstring).slen = (int)sVar1;
    uVar3 = (int)sVar1 + 1;
    (this->super_tagbstring).mlen = uVar3;
    __dest = (uchar *)malloc((ulong)uVar3);
    (this->super_tagbstring).data = __dest;
    if (__dest != (uchar *)0x0) {
      memcpy(__dest,s,(ulong)uVar3);
      return;
    }
  }
  (this->super_tagbstring).data = (uchar *)0x0;
  std::__cxx11::string::string
            ((string *)&local_58,"CBString::Failure in (char *) constructor",&local_81);
  CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(pCVar2,&bstr__cppwrapper_exception);
  __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

CBString::CBString (const char *s) {
	if (s) {
		size_t sslen = strlen (s);
		if (sslen >= INT_MAX) bstringThrow ("Failure in (char *) constructor, string too large")
		slen = (int) sslen;
		mlen = slen + 1;
		if (NULL != (data = (unsigned char *) bstr__alloc (mlen))) {
			bstr__memcpy (data, s, mlen);
			return;
		}
	}
	data = NULL;
	bstringThrow ("Failure in (char *) constructor");
}